

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::clara::TextFlow::Columns::iterator::operator*[abi_cxx11_(iterator *this)

{
  iterator *piVar1;
  ulong uVar2;
  undefined1 uVar3;
  size_type sVar4;
  const_reference this_00;
  const_reference __lhs;
  iterator *piVar5;
  long lVar6;
  undefined8 *in_RSI;
  iterator *in_RDI;
  string col;
  size_t width;
  size_t i;
  string padding;
  string *row;
  iterator *in_stack_fffffffffffffe88;
  iterator *in_stack_fffffffffffffe90;
  Column *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffeb0;
  iterator *this_01;
  undefined1 local_111 [40];
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [96];
  iterator *local_48;
  ulong local_40;
  string local_38 [39];
  byte local_11;
  
  local_11 = 0;
  this_01 = in_RDI;
  ::std::__cxx11::string::string((string *)in_RDI);
  ::std::__cxx11::string::string(local_38);
  local_40 = 0;
  while( true ) {
    uVar2 = local_40;
    sVar4 = std::
            vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
            ::size((vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                    *)*in_RSI);
    if (sVar4 <= uVar2) break;
    this_00 = std::
              vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
              ::operator[]((vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                            *)*in_RSI,local_40);
    local_48 = (iterator *)Column::width(this_00);
    __lhs = std::
            vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
            ::operator[]((vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
                          *)(in_RSI + 1),local_40);
    std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
    operator[]((vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                *)*in_RSI,local_40);
    Column::end(in_stack_fffffffffffffea0);
    uVar3 = Column::iterator::operator!=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    if ((bool)uVar3) {
      std::
      vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
      ::operator[]((vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
                    *)(in_RSI + 1),local_40);
      Column::iterator::operator*[abi_cxx11_(this_01);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar3,in_stack_fffffffffffffeb0));
      ::std::__cxx11::string::operator+=((string *)in_RDI,local_c8);
      ::std::__cxx11::string::~string(local_c8);
      piVar5 = (iterator *)::std::__cxx11::string::size();
      piVar1 = local_48;
      if (piVar5 < local_48) {
        lVar6 = ::std::__cxx11::string::size();
        in_stack_fffffffffffffea0 = (Column *)((long)piVar1 - lVar6);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_e8,(ulong)in_stack_fffffffffffffea0,' ',&local_e9);
        ::std::__cxx11::string::operator=(local_38,local_e8);
        ::std::__cxx11::string::~string(local_e8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      }
      else {
        ::std::__cxx11::string::operator=(local_38,"");
      }
      ::std::__cxx11::string::~string(local_a8);
    }
    else {
      in_stack_fffffffffffffe90 = (iterator *)local_111;
      in_stack_fffffffffffffe88 = local_48;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)(local_111 + 1),(ulong)in_stack_fffffffffffffe88,' ',
                 (allocator *)in_stack_fffffffffffffe90);
      ::std::__cxx11::string::operator+=(local_38,(string *)(local_111 + 1));
      ::std::__cxx11::string::~string((string *)(local_111 + 1));
      ::std::allocator<char>::~allocator((allocator<char> *)local_111);
    }
    local_40 = local_40 + 1;
  }
  local_11 = 1;
  ::std::__cxx11::string::~string(local_38);
  if ((local_11 & 1) == 0) {
    ::std::__cxx11::string::~string((string *)in_RDI);
  }
  return (string *)this_01;
}

Assistant:

auto operator *() const -> std::string {
			std::string row, padding;

			for (size_t i = 0; i < m_columns.size(); ++i) {
				auto width = m_columns[i].width();
				if (m_iterators[i] != m_columns[i].end()) {
					std::string col = *m_iterators[i];
					row += padding + col;
					if (col.size() < width)
						padding = std::string(width - col.size(), ' ');
					else
						padding = "";
				} else {
					padding += std::string(width, ' ');
				}
			}
			return row;
		}